

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O3

Function * __thiscall soul::Module::Functions::get(Functions *this,string_view name)

{
  size_t sVar1;
  pool_ref<soul::heart::Function> *ppVar2;
  Function *pFVar3;
  bool bVar4;
  long lVar5;
  
  sVar1 = (this->functions).numActive;
  if (sVar1 != 0) {
    ppVar2 = (this->functions).items;
    lVar5 = 0;
    do {
      bVar4 = Identifier::operator==
                        ((Identifier *)(*(long *)((long)&ppVar2->object + lVar5) + 0x30),name);
      if (bVar4) {
        pFVar3 = *(Function **)((long)&ppVar2->object + lVar5);
        if (pFVar3 != (Function *)0x0) {
          return pFVar3;
        }
        break;
      }
      lVar5 = lVar5 + 8;
    } while (sVar1 << 3 != lVar5);
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

Module& Module::createProcessor (Program& p)    { return p.getAllocator().allocate<Module> (p, ModuleType::processorModule); }